

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O1

void __thiscall HighsSearch::solveDepthFirst(HighsSearch *this,int64_t maxbacktracks)

{
  bool bVar1;
  NodeResult NVar2;
  long lVar3;
  bool bVar4;
  
  if (maxbacktracks != 0) {
    lVar3 = maxbacktracks + -1;
    while (NVar2 = dive(this), NVar2 != kOpen) {
      bVar1 = backtrack(this,true);
      bVar4 = lVar3 == 0;
      lVar3 = lVar3 + -1;
      if (!bVar1) {
        return;
      }
      if (bVar4) {
        return;
      }
    }
  }
  return;
}

Assistant:

void HighsSearch::solveDepthFirst(int64_t maxbacktracks) {
  do {
    if (maxbacktracks == 0) break;

    NodeResult result = dive();
    // if a limit was reached the result might be open
    if (result == NodeResult::kOpen) break;

    --maxbacktracks;

  } while (backtrack());
}